

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::scrape_tracker_url(torrent *this,string *url,bool user_triggered)

{
  bool bVar1;
  announce_entry *local_28;
  announce_entry *ae;
  bool user_triggered_local;
  string *url_local;
  torrent *this_local;
  
  bVar1 = tracker_list::empty(&this->m_trackers);
  if (!bVar1) {
    local_28 = tracker_list::find_tracker(&this->m_trackers,url);
    if (local_28 == (announce_entry *)0x0) {
      local_28 = tracker_list::last_working(&this->m_trackers);
    }
    if (local_28 == (announce_entry *)0x0) {
      local_28 = tracker_list::first(&this->m_trackers);
    }
    if (local_28 != (announce_entry *)0x0) {
      scrape_tracker_impl(this,local_28,user_triggered);
    }
  }
  return;
}

Assistant:

void torrent::scrape_tracker_url(std::string url, bool const user_triggered)
	{
		TORRENT_ASSERT(is_single_thread());
		if (m_trackers.empty()) return;

		aux::announce_entry* ae = m_trackers.find_tracker(url);
		if (ae == nullptr) ae = m_trackers.last_working();
		if (ae == nullptr) ae = m_trackers.first();
		if (ae == nullptr) return;

		scrape_tracker_impl(*ae, user_triggered);
	}